

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_font_x.cxx
# Opt level: O0

void __thiscall Fl_Font_Descriptor::Fl_Font_Descriptor(Fl_Font_Descriptor *this,char *name)

{
  XUtf8FontStruct *pXVar1;
  int local_1c;
  int u;
  char *name_local;
  Fl_Font_Descriptor *this_local;
  
  pXVar1 = XCreateUtf8FontStruct(fl_display,name);
  this->font = pXVar1;
  if (this->font == (XUtf8FontStruct *)0x0) {
    (*Fl::warning)("bad font: %s",name);
    pXVar1 = XCreateUtf8FontStruct(fl_display,"fixed");
    this->font = pXVar1;
  }
  this->listbase = 0;
  for (local_1c = 0; local_1c < 0x40; local_1c = local_1c + 1) {
    this->glok[local_1c] = '\0';
  }
  return;
}

Assistant:

Fl_Font_Descriptor::Fl_Font_Descriptor(const char* name) {
  font = XCreateUtf8FontStruct(fl_display, name);
  if (!font) {
    Fl::warning("bad font: %s", name);
    font = XCreateUtf8FontStruct(fl_display, "fixed");
  }
#  if HAVE_GL
  listbase = 0;
  for (int u = 0; u < 64; u++) glok[u] = 0;
#  endif
}